

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O0

int llhttp__internal_execute(llhttp__internal_t *state,char *p,char *endp)

{
  llparse_state_t lVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int error;
  llparse_state_t next;
  uchar *in_stack_00000e58;
  uchar *in_stack_00000e60;
  llhttp__internal_t *in_stack_00000e68;
  int local_4;
  
  if (*(int *)(in_RDI + 0x18) == 0) {
    if (*(long *)(in_RDI + 8) != 0) {
      *(undefined8 *)(in_RDI + 8) = in_RSI;
    }
    lVar1 = llhttp__internal__run(in_stack_00000e68,in_stack_00000e60,in_stack_00000e58);
    if (lVar1 == s_error) {
      local_4 = *(int *)(in_RDI + 0x18);
    }
    else {
      *(ulong *)(in_RDI + 0x38) = (ulong)lVar1;
      if ((*(long *)(in_RDI + 8) == 0) ||
         (local_4 = (**(code **)(in_RDI + 0x10))(in_RDI,*(undefined8 *)(in_RDI + 8),in_RDX),
         local_4 == 0)) {
        local_4 = 0;
      }
      else {
        *(int *)(in_RDI + 0x18) = local_4;
        *(undefined8 *)(in_RDI + 0x28) = in_RDX;
      }
    }
  }
  else {
    local_4 = *(int *)(in_RDI + 0x18);
  }
  return local_4;
}

Assistant:

int llhttp__internal_execute(llhttp__internal_t* state, const char* p, const char* endp) {
  llparse_state_t next;

  /* check lingering errors */
  if (state->error != 0) {
    return state->error;
  }

  /* restart spans */
  if (state->_span_pos0 != NULL) {
    state->_span_pos0 = (void*) p;
  }
  
  next = llhttp__internal__run(state, (const unsigned char*) p, (const unsigned char*) endp);
  if (next == s_error) {
    return state->error;
  }
  state->_current = (void*) (intptr_t) next;

  /* execute spans */
  if (state->_span_pos0 != NULL) {
    int error;
  
    error = ((llhttp__internal__span_cb) state->_span_cb0)(state, state->_span_pos0, (const char*) endp);
    if (error != 0) {
      state->error = error;
      state->error_pos = endp;
      return error;
    }
  }
  
  return 0;
}